

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O3

void __thiscall YAML::EmitterState::SetLocalValue(EmitterState *this,EMITTER_MANIP value)

{
  long lVar1;
  
  if (value - EmitNonAscii < 3) {
    _Set<YAML::EMITTER_MANIP>(this,&this->m_charset,value,Local);
  }
  if (((((value < LowerNull) && (lVar1 = 0x2c, (0x1c1U >> (value & EndMap) & 1) != 0)) ||
       (lVar1 = 0x30, value - YesNoBool < 3)) ||
      ((lVar1 = 0x38, value - UpperCase < 3 || (lVar1 = 0x34, value - LongBool < 2)))) ||
     ((lVar1 = 0x3c, value - LowerNull < 4 || (lVar1 = 0x40, value - Dec < 3)))) {
    _Set<YAML::EMITTER_MANIP>
              (this,(Setting<YAML::EMITTER_MANIP> *)(&this->m_isGood + lVar1),value,Local);
  }
  if ((value & ~TagByKind) == Flow) {
    _Set<YAML::EMITTER_MANIP>(this,&this->m_seqFmt,value,Local);
    _Set<YAML::EMITTER_MANIP>(this,&this->m_mapFmt,value,Local);
  }
  if ((value != LongKey) && (value != Auto)) {
    return;
  }
  _Set<YAML::EMITTER_MANIP>(this,&this->m_mapKeyFmt,value,Local);
  return;
}

Assistant:

void EmitterState::SetLocalValue(EMITTER_MANIP value) {
  SetOutputCharset(value, FmtScope::Local);
  SetStringFormat(value, FmtScope::Local);
  SetBoolFormat(value, FmtScope::Local);
  SetBoolCaseFormat(value, FmtScope::Local);
  SetBoolLengthFormat(value, FmtScope::Local);
  SetNullFormat(value, FmtScope::Local);
  SetIntFormat(value, FmtScope::Local);
  SetFlowType(GroupType::Seq, value, FmtScope::Local);
  SetFlowType(GroupType::Map, value, FmtScope::Local);
  SetMapKeyFormat(value, FmtScope::Local);
}